

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Part_One_t * Part_ManMergeEntry(Part_Man_t *pMan,Part_One_t *p1,Part_One_t *p2,int nRefs)

{
  int iVar1;
  int iVar2;
  Part_One_t *pPVar3;
  int *pEnd2;
  int *pEnd1;
  int *pBeg;
  int *pBeg2;
  int *pBeg1;
  Part_One_t *p;
  int nRefs_local;
  Part_One_t *p2_local;
  Part_One_t *p1_local;
  Part_Man_t *pMan_local;
  
  pPVar3 = Part_ManFetchEntry(pMan,p1->nOuts + p2->nOuts,nRefs);
  pBeg2 = &p1[1].nRefs;
  pBeg = &p2[1].nRefs;
  pEnd1 = &pPVar3[1].nRefs;
  iVar1 = p1->nOuts;
  iVar2 = p2->nOuts;
  while (pBeg2 < &p1[1].nRefs + iVar1 && pBeg < &p2[1].nRefs + iVar2) {
    if (*pBeg2 == *pBeg) {
      *pEnd1 = *pBeg2;
      pBeg = pBeg + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pBeg) {
      *pEnd1 = *pBeg2;
      pBeg2 = pBeg2 + 1;
    }
    else {
      *pEnd1 = *pBeg;
      pBeg = pBeg + 1;
    }
    pEnd1 = pEnd1 + 1;
  }
  while (pBeg2 < &p1[1].nRefs + iVar1) {
    *pEnd1 = *pBeg2;
    pEnd1 = pEnd1 + 1;
    pBeg2 = pBeg2 + 1;
  }
  while (pBeg < &p2[1].nRefs + iVar2) {
    *pEnd1 = *pBeg;
    pEnd1 = pEnd1 + 1;
    pBeg = pBeg + 1;
  }
  pPVar3->nOuts = (int)((long)pEnd1 - (long)(pPVar3 + 1) >> 2);
  if (pPVar3->nOutsAlloc < pPVar3->nOuts) {
    __assert_fail("p->nOuts <= p->nOutsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0xea,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (pPVar3->nOuts < p1->nOuts) {
    __assert_fail("p->nOuts >= p1->nOuts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0xeb,
                  "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
  }
  if (p2->nOuts <= pPVar3->nOuts) {
    return pPVar3;
  }
  __assert_fail("p->nOuts >= p2->nOuts",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0xec,
                "Part_One_t *Part_ManMergeEntry(Part_Man_t *, Part_One_t *, Part_One_t *, int)");
}

Assistant:

Part_One_t * Part_ManMergeEntry( Part_Man_t * pMan, Part_One_t * p1, Part_One_t * p2, int nRefs )
{
    Part_One_t * p = Part_ManFetchEntry( pMan, p1->nOuts + p2->nOuts, nRefs );
    int * pBeg1 = p1->pOuts;
    int * pBeg2 = p2->pOuts;
    int * pBeg  = p->pOuts;
    int * pEnd1 = p1->pOuts + p1->nOuts;
    int * pEnd2 = p2->pOuts + p2->nOuts;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( *pBeg1 < *pBeg2 )
            *pBeg++ = *pBeg1++;
        else 
            *pBeg++ = *pBeg2++;
    }
    while ( pBeg1 < pEnd1 )
        *pBeg++ = *pBeg1++;
    while ( pBeg2 < pEnd2 )
        *pBeg++ = *pBeg2++;
    p->nOuts = pBeg - p->pOuts;
    assert( p->nOuts <= p->nOutsAlloc );
    assert( p->nOuts >= p1->nOuts );
    assert( p->nOuts >= p2->nOuts );
    return p;
}